

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O0

Boolean convertUTF::isLegalUTF8String(UTF8 *string,size_t length)

{
  Boolean BVar1;
  int length_00;
  UTF8 *seqEnd;
  int seqLength;
  UTF8 *stringEnd;
  size_t length_local;
  UTF8 *string_local;
  
  length_local = (size_t)string;
  do {
    if (string + length <= length_local) {
      return true;
    }
    length_00 = (char)trailingBytesForUTF8[*(byte *)length_local] + 1;
  } while (((length_00 < 5) && ((UTF8 *)(length_local + (long)length_00) <= string + length)) &&
          (BVar1 = anon_unknown_11::isLegalUTF8((UTF8 *)length_local,length_00),
          length_local = length_local + (long)length_00, BVar1));
  return false;
}

Assistant:

Boolean isLegalUTF8String(const UTF8* string, const size_t length)
{
    /* same as above, but verify if the whole passed bytestream consists of valid UTF-8 sequences only. */
    const auto stringEnd = string + length;
    while (string < stringEnd)
    {
        const auto seqLength = trailingBytesForUTF8[*string] + 1;
        const auto seqEnd = string + seqLength;
        /* as the comment for the trailing bytes array notes, valid UTF-8 cannot contain 5- or 6-byte sequences. */
        if (seqLength >= 5 || seqEnd > stringEnd || !isLegalUTF8(string, seqLength))
        {
            return false;
        }
        string = seqEnd;
    }
    return true;
}